

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkmap.c
# Opt level: O1

void remove_rooms(level *lev,int lx,int ly,int hx,int hy)

{
  char cVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  undefined1 *puVar6;
  long lVar7;
  uint *puVar8;
  mkroom *croom;
  coord *__dest;
  ulong uVar9;
  
  uVar9 = (ulong)lev->nroom;
  if (0 < (long)uVar9) {
    do {
      iVar4 = (int)lev->doors[uVar9 * 0x6c + 0xc].y;
      if (lx <= iVar4) {
        __dest = lev->doors + uVar9 * 0x6c + 0xc;
        if (((__dest->x < hx) && (ly <= __dest[1].y)) && (__dest[1].x < hy)) {
          if (((__dest[1].y < hy) && (iVar4 < hx)) && ((lx <= __dest->x && (ly <= __dest[1].x)))) {
            uVar2 = lev->nroom;
            lev->nroom = uVar2 - 1;
            if (uVar9 != uVar2) {
              memcpy(__dest,lev->doors + (long)(int)uVar2 * 0x6c + 0xc,0xd8);
              cVar1 = __dest->x;
              if (cVar1 <= __dest->y) {
                iVar4 = lev->nroom;
                puVar6 = &lev->locations[cVar1][0].field_0x6;
                lVar5 = (long)cVar1;
                do {
                  cVar1 = __dest[1].x;
                  if (cVar1 <= __dest[1].y) {
                    lVar7 = (long)cVar1 + -1;
                    puVar8 = (uint *)(puVar6 + (long)cVar1 * 0xc);
                    do {
                      if ((*puVar8 >> 0x10 & 0x3f) == iVar4 + 3U) {
                        *puVar8 = *puVar8 & 0xffc0ffff |
                                  (int)(uVar9 - 1) * 0x10000 + 0x30000U & 0x3f0000;
                      }
                      lVar7 = lVar7 + 1;
                      puVar8 = puVar8 + 3;
                    } while (lVar7 < __dest[1].y);
                  }
                  puVar6 = puVar6 + 0xfc;
                  bVar3 = lVar5 < __dest->y;
                  lVar5 = lVar5 + 1;
                } while (bVar3);
              }
            }
            lev->doors[(long)(int)uVar2 * 0x6c + 0xc].y = -1;
          }
          else if (__dest[5].x == '\0') {
            impossible("regular room in joined map");
          }
        }
      }
      bVar3 = 1 < (long)uVar9;
      uVar9 = uVar9 - 1;
    } while (bVar3);
  }
  return;
}

Assistant:

void remove_rooms(struct level *lev, int lx, int ly, int hx, int hy)
{
    int i;
    struct mkroom *croom;

    for (i = lev->nroom - 1; i >= 0; --i) {
	croom = &lev->rooms[i];
	if (croom->hx < lx || croom->lx >= hx ||
	    croom->hy < ly || croom->ly >= hy) continue; /* no overlap */

	if (croom->lx < lx || croom->hx >= hx ||
	    croom->ly < ly || croom->hy >= hy) { /* partial overlap */
	    /* TODO: ensure remaining parts of room are still joined */

	    if (!croom->irregular) impossible("regular room in joined map");
	} else {
	    /* total overlap, remove the room */
	    remove_room(lev, (unsigned)i);
	}
    }
}